

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::clear(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *this)

{
  ulong uVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  if (this->size_ != 0) {
    uVar1 = this->capacity_;
    if (0x7f < uVar1) {
      destroy_slots(this);
      return;
    }
    if (uVar1 != 0) {
      lVar2 = 0;
      for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
        if (-1 < this->ctrl_[uVar3]) {
          std::__cxx11::string::~string((string *)((long)this->slots_ + lVar2));
          uVar1 = this->capacity_;
        }
        lVar2 = lVar2 + 0x28;
      }
      this->size_ = 0;
      memset(this->ctrl_,0x80,uVar1 + 0x10);
      this->ctrl_[this->capacity_] = -1;
      (this->settings_).
      super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
      .
      super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_0UL,_false>
      .value = this->capacity_ - ((this->capacity_ >> 3) + this->size_);
    }
  }
  return;
}

Assistant:

size_t capacity() const { return capacity_; }